

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

ARGBBlendRow GetARGBBlend(void)

{
  uint uVar1;
  code *pcVar2;
  
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar1 & 0x40) == 0) {
    pcVar2 = ARGBBlendRow_C;
  }
  else {
    pcVar2 = ARGBBlendRow_SSSE3;
  }
  return pcVar2;
}

Assistant:

LIBYUV_API
ARGBBlendRow GetARGBBlend() {
  void (*ARGBBlendRow)(const uint8_t* src_argb, const uint8_t* src_argb1,
                       uint8_t* dst_argb, int width) = ARGBBlendRow_C;
#if defined(HAS_ARGBBLENDROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBBlendRow = ARGBBlendRow_SSSE3;
    return ARGBBlendRow;
  }
#endif
#if defined(HAS_ARGBBLENDROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBBlendRow = ARGBBlendRow_NEON;
  }
#endif
#if defined(HAS_ARGBBLENDROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBBlendRow = ARGBBlendRow_MMI;
  }
#endif
#if defined(HAS_ARGBBLENDROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBBlendRow = ARGBBlendRow_MSA;
  }
#endif
  return ARGBBlendRow;
}